

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall
testing::internal::OnCallSpec<void_(void_*,_unsigned_long)>::Matches
          (OnCallSpec<void_(void_*,_unsigned_long)> *this,ArgumentTuple *args)

{
  bool bVar1;
  tuple<testing::Matcher<void_*>,_testing::Matcher<unsigned_long>_> *in_RDI;
  tuple<void_*,_unsigned_long> *in_stack_00000008;
  MatcherBase<const_std::tuple<void_*,_unsigned_long>_&> *in_stack_00000010;
  tuple<void_*,_unsigned_long> *in_stack_ffffffffffffffd8;
  undefined1 local_11;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<void*>,testing::Matcher<unsigned_long>>,std::tuple<void*,unsigned_long>>
                    (in_RDI,in_stack_ffffffffffffffd8);
  local_11 = false;
  if (bVar1) {
    local_11 = MatcherBase<const_std::tuple<void_*,_unsigned_long>_&>::Matches
                         (in_stack_00000010,in_stack_00000008);
  }
  return local_11;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }